

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::SideShapeFunction
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  MElementType MVar5;
  uint uVar6;
  long lVar7;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  TPZFMatrix<double> *pTVar16;
  long lVar17;
  undefined1 auVar18 [16];
  REAL detjac;
  TPZManVector<int,_9> ord;
  TPZManVector<int,_9> permutegather;
  TPZGeoElSide gelside;
  TPZManVector<long,_8> id;
  TPZFNMatrix<9,_double> jac;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> axes;
  TPZManVector<long,_28> FirstIndex;
  TPZFNMatrix<50,_double> dphiloc;
  TPZFNMatrix<50,_double> philoc;
  REAL local_960;
  TPZVec<double> *local_958;
  long local_950;
  TPZFMatrix<double> *local_948;
  ulong local_940;
  undefined8 local_938;
  TPZVec<int> local_930;
  uint local_910 [10];
  ulong local_8e8;
  TPZManVector<int,_9> local_8e0;
  TPZGeoElSide local_898;
  TPZManVector<long,_8> local_880;
  undefined1 local_820 [88];
  int local_7c8 [6];
  undefined **local_7b0;
  undefined1 local_7a8 [16];
  int64_t local_798;
  double local_790 [10];
  undefined1 local_740 [88];
  int local_6e8 [6];
  undefined **local_6d0;
  undefined1 local_6c8 [16];
  int64_t local_6b8;
  double local_6b0 [10];
  undefined1 local_660 [88];
  int local_608 [6];
  undefined **local_5f0;
  undefined1 local_5e8 [16];
  int64_t local_5d8;
  double local_5d0 [10];
  TPZManVector<long,_28> local_580;
  undefined1 local_480 [88];
  int local_428 [6];
  undefined **local_410;
  undefined1 local_408 [16];
  int64_t local_3f8;
  double local_3f0 [51];
  undefined1 local_258 [88];
  int local_200 [6];
  undefined **local_1e8;
  undefined1 local_1e0 [16];
  int64_t local_1d0;
  double local_1c8 [51];
  
  local_948 = dphi;
  if ((side == 9) || (point->fNElements != 1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Don\'t have side shape associated to this side",0x2d);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
               ,0x1cf);
  }
  iVar1 = pztopology::TPZQuadrilateral::SideDimension(side);
  if (iVar1 == 1) {
    local_958 = point;
    local_938 = phi;
    iVar1 = pztopology::TPZQuadrilateral::NContainedSides(side);
    iVar14 = 0;
    uVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x250))(this,0,side);
    lVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,uVar2);
    uVar9 = (uint)*(byte *)(lVar7 + 0x14);
    if (0 < iVar1) {
      iVar14 = 0;
      iVar11 = 0;
      do {
        iVar3 = pztopology::TPZQuadrilateral::ContainedSideLocId(side,iVar11);
        iVar3 = pzshape::TPZShapeQuad::NConnectShapeF(iVar3,uVar9);
        iVar14 = iVar14 + iVar3;
        iVar11 = iVar11 + 1;
      } while (iVar1 != iVar11);
    }
    this_00 = TPZCompEl::Reference((TPZCompEl *)this);
    uVar4 = pztopology::TPZQuadrilateral::NSideNodes(side);
    TPZManVector<long,_8>::TPZManVector(&local_880,(long)(int)uVar4);
    if (0 < (int)uVar4) {
      uVar12 = 0;
      do {
        iVar11 = pztopology::TPZQuadrilateral::SideNodeLocId(side,(int)uVar12);
        pTVar8 = TPZGeoEl::Node(this_00,iVar11);
        local_880.super_TPZVec<long>.fStore[uVar12] = (long)pTVar8->fId;
        uVar12 = uVar12 + 1;
      } while (uVar4 != uVar12);
    }
    TPZManVector<int,_9>::TPZManVector(&local_8e0,(long)iVar1);
    MVar5 = pztopology::TPZQuadrilateral::Type(side);
    if (MVar5 == EOned) {
      iVar1 = pztopology::TPZLine::GetTransformId(&local_880.super_TPZVec<long>);
      pztopology::TPZLine::GetSideHDivPermutation(iVar1,&local_8e0.super_TPZVec<int>);
    }
    else if (MVar5 == ETriangle) {
      iVar1 = pztopology::TPZTriangle::GetTransformId(&local_880.super_TPZVec<long>);
      pztopology::TPZTriangle::GetSideHDivPermutation(iVar1,&local_8e0.super_TPZVec<int>);
    }
    else {
      if (MVar5 != EQuadrilateral) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
                   ,0x200);
      }
      iVar1 = pztopology::TPZQuadrilateral::GetTransformId(&local_880.super_TPZVec<long>);
      pztopology::TPZQuadrilateral::GetSideHDivPermutation(iVar1,&local_8e0.super_TPZVec<int>);
    }
    TPZVec<int>::TPZVec(&local_930,0);
    local_930.fStore = (int *)local_910;
    local_930._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e55d0;
    local_930.fNElements = 9;
    local_930.fNAlloc = 0;
    lVar7 = 9;
    auVar18 = _DAT_014f8340;
    do {
      if (SUB164(auVar18 ^ _DAT_014f8350,4) == -0x80000000 &&
          SUB164(auVar18 ^ _DAT_014f8350,0) < -0x7ffffff7) {
        *(uint *)((long)&local_938 + lVar7 * 4 + 4) = uVar9;
        *(uint *)((long)&local_930._vptr_TPZVec + lVar7 * 4) = uVar9;
      }
      lVar10 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar10 + 2;
      lVar7 = lVar7 + 2;
    } while (lVar7 != 0x13);
    uVar4 = pztopology::TPZQuadrilateral::SideDimension(side);
    local_950 = CONCAT44(local_950._4_4_,MVar5);
    lVar7 = (long)iVar14;
    local_258._32_8_ = local_1c8;
    local_258._16_8_ = 1;
    local_258._8_8_ = lVar7;
    local_258[0x18] = '\0';
    local_258[0x19] = '\0';
    local_258._0_8_ = &PTR__TPZFMatrix_018e0e68;
    local_258._48_8_ = 0x32;
    local_258._40_8_ = local_258._32_8_;
    TPZVec<int>::TPZVec((TPZVec<int> *)(local_258 + 0x38),0);
    local_258._64_8_ = local_200;
    local_258._56_8_ = &PTR__TPZManVector_0183cde8;
    local_258._72_16_ = (undefined1  [16])0x0;
    local_1e8 = &PTR__TPZVec_0183b4b0;
    local_1e0 = (undefined1  [16])0x0;
    local_1d0 = 0;
    if (iVar14 == 0) {
      local_258._32_8_ = (double *)0x0;
    }
    else if (0x32 < iVar14) {
      local_258._32_8_ = operator_new__(lVar7 * 8);
    }
    local_258._0_8_ = &PTR__TPZFNMatrix_018e0b78;
    local_480._32_8_ = local_3f0;
    local_480._16_8_ = lVar7;
    local_480._8_8_ = (long)(int)uVar4;
    local_480[0x18] = '\0';
    local_480[0x19] = '\0';
    local_480._0_8_ = &PTR__TPZFMatrix_018e0e68;
    local_480._48_8_ = 0x32;
    local_480._40_8_ = local_480._32_8_;
    TPZVec<int>::TPZVec((TPZVec<int> *)(local_480 + 0x38),0);
    local_480._64_8_ = local_428;
    local_480._56_8_ = &PTR__TPZManVector_0183cde8;
    local_480._72_16_ = (undefined1  [16])0x0;
    local_410 = &PTR__TPZVec_0183b4b0;
    local_408 = (undefined1  [16])0x0;
    local_3f8 = 0;
    uVar12 = (int)uVar4 * lVar7;
    if (uVar12 == 0) {
      local_480._32_8_ = (double *)0x0;
    }
    else if (0x32 < (long)uVar12) {
      uVar15 = 0xffffffffffffffff;
      if (uVar12 < 0x2000000000000000) {
        uVar15 = uVar12 * 8;
      }
      local_480._32_8_ = operator_new__(uVar15);
    }
    local_480._0_8_ = &PTR__TPZFNMatrix_018e0b78;
    pzshape::TPZShapeQuad::SideShape
              (side,local_958,&local_880.super_TPZVec<long>,&local_930,
               (TPZFMatrix<double> *)local_258,(TPZFMatrix<double> *)local_480);
    uVar6 = pztopology::TPZQuadrilateral::NContainedSides(side);
    local_820._0_8_ = (_func_int **)0x0;
    TPZManVector<long,_28>::TPZManVector(&local_580,(long)(int)(uVar6 + 1),(long *)local_820);
    if (0 < (int)uVar6) {
      uVar12 = 0;
      do {
        iVar1 = pztopology::TPZQuadrilateral::ContainedSideLocId(side,(int)uVar12);
        lVar7 = local_580.super_TPZVec<long>.fStore[uVar12];
        iVar1 = pzshape::TPZShapeQuad::NConnectShapeF(iVar1,uVar9);
        local_580.super_TPZVec<long>.fStore[uVar12 + 1] = lVar7 + iVar1;
        uVar12 = uVar12 + 1;
      } while (uVar6 != uVar12);
    }
    local_960 = 1.0;
    local_898.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
    local_898.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
    local_898.fSide = side;
    iVar1 = (**(code **)(*(long *)this_00 + 0x208))();
    lVar7 = (long)iVar1;
    local_820._32_8_ = local_790;
    local_820._16_8_ = lVar7;
    local_820._8_8_ = lVar7;
    local_820[0x18] = '\0';
    local_820[0x19] = '\0';
    local_820._0_8_ = &PTR__TPZFMatrix_0183dbe0;
    local_820._48_8_ = 9;
    local_820._40_8_ = local_820._32_8_;
    TPZVec<int>::TPZVec((TPZVec<int> *)(local_820 + 0x38),0);
    local_820._64_8_ = local_7c8;
    local_820._56_8_ = &PTR__TPZManVector_0183cde8;
    local_820._72_16_ = (undefined1  [16])0x0;
    local_7b0 = &PTR__TPZVec_0183b4b0;
    local_7a8 = (undefined1  [16])0x0;
    local_798 = 0;
    uVar12 = lVar7 * lVar7;
    if (iVar1 == 0) {
      local_820._32_8_ = (double *)0x0;
    }
    else if (9 < uVar12) {
      uVar15 = 0xffffffffffffffff;
      if (uVar12 < 0x2000000000000000) {
        uVar15 = uVar12 * 8;
      }
      local_820._32_8_ = operator_new__(uVar15);
    }
    local_820._0_8_ = &PTR__TPZFNMatrix_0183d8f0;
    local_740._32_8_ = local_6b0;
    local_740._16_8_ = lVar7;
    local_740._8_8_ = lVar7;
    local_740[0x18] = '\0';
    local_740[0x19] = '\0';
    local_740._0_8_ = &PTR__TPZFMatrix_0183dbe0;
    local_740._48_8_ = 9;
    local_8e8 = (ulong)uVar6;
    local_740._40_8_ = local_740._32_8_;
    TPZVec<int>::TPZVec((TPZVec<int> *)(local_740 + 0x38),0);
    local_740._64_8_ = local_6e8;
    local_740._56_8_ = &PTR__TPZManVector_0183cde8;
    local_740._72_16_ = (undefined1  [16])0x0;
    local_6d0 = &PTR__TPZVec_0183b4b0;
    local_6c8 = (undefined1  [16])0x0;
    local_6b8 = 0;
    if (iVar1 == 0) {
      local_740._32_8_ = (double *)0x0;
    }
    else if (9 < uVar12) {
      uVar15 = 0xffffffffffffffff;
      if (uVar12 < 0x2000000000000000) {
        uVar15 = uVar12 * 8;
      }
      local_740._32_8_ = operator_new__(uVar15);
    }
    local_740._0_8_ = &PTR__TPZFNMatrix_0183d8f0;
    local_660._32_8_ = local_5d0;
    local_660._16_8_ = 3;
    local_660._8_8_ = lVar7;
    local_660[0x18] = '\0';
    local_660[0x19] = '\0';
    local_660._0_8_ = &PTR__TPZFMatrix_0183dbe0;
    local_660._48_8_ = 9;
    local_660._40_8_ = local_660._32_8_;
    TPZVec<int>::TPZVec((TPZVec<int> *)(local_660 + 0x38),0);
    pTVar16 = local_938;
    local_660._64_8_ = local_608;
    local_660._56_8_ = &PTR__TPZManVector_0183cde8;
    local_660._72_16_ = (undefined1  [16])0x0;
    local_5f0 = &PTR__TPZVec_0183b4b0;
    local_5e8 = (undefined1  [16])0x0;
    local_5d8 = 0;
    iVar14 = (int)local_950;
    if (iVar1 == 0) {
      local_660._32_8_ = (double *)0x0;
    }
    else if (3 < iVar1) {
      uVar12 = 0xffffffffffffffff;
      if ((ulong)(lVar7 * 3) < 0x2000000000000000) {
        uVar12 = lVar7 * 0x18;
      }
      local_660._32_8_ = operator_new__(uVar12);
    }
    local_660._0_8_ = &PTR__TPZFNMatrix_0183d8f0;
    TPZGeoElSide::Jacobian
              (&local_898,local_958,(TPZFMatrix<double> *)local_820,(TPZFMatrix<double> *)local_660,
               &local_960,(TPZFMatrix<double> *)local_740);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_660,&PTR_PTR_0183dba8);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_740,&PTR_PTR_0183dba8);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_820,&PTR_PTR_0183dba8);
    if (iVar14 == 2) {
      local_960 = local_960 / 6.0;
    }
    if (0 < (int)uVar6) {
      uVar12 = 0;
      do {
        local_940 = uVar12;
        uVar9 = (int)local_580.super_TPZVec<long>.fStore[local_940 + 1] -
                (int)local_580.super_TPZVec<long>.fStore[local_940];
        if (0 < (int)uVar9) {
          local_958 = (TPZVec<double> *)
                      (long)(int)local_580.super_TPZVec<long>.fStore
                                 [local_8e0.super_TPZVec<int>.fStore[local_940]];
          local_950 = (long)(int)local_580.super_TPZVec<long>.fStore[local_940];
          lVar7 = (long)local_958 * 8;
          lVar10 = local_950 * 8;
          uVar12 = 0;
          do {
            lVar17 = (long)&local_958->_vptr_TPZVec + uVar12;
            if (((lVar17 < 0) || ((long)local_258._8_8_ <= lVar17)) || ((long)local_258._16_8_ < 1))
            {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar13 = uVar12 + local_950;
            if (((lVar13 < 0) ||
                ((pTVar16->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar13)) ||
               ((pTVar16->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pTVar16->fElem[lVar13] = *(double *)(local_258._32_8_ + lVar17 * 8) / local_960;
            if (0 < (int)uVar4) {
              uVar15 = 0;
              do {
                if ((((long)local_480._8_8_ <= (long)uVar15) || (lVar17 < 0)) ||
                   ((long)local_480._16_8_ <= lVar17)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((local_948->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar15)
                    || (lVar13 < 0)) ||
                   ((local_948->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar13)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)
                 ((long)local_948->fElem +
                 uVar15 * 8 + (local_948->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar10
                 ) = *(double *)(local_480._32_8_ + uVar15 * 8 + local_480._8_8_ * lVar7) /
                     local_960;
                uVar15 = uVar15 + 1;
              } while (uVar4 != uVar15);
            }
            uVar12 = uVar12 + 1;
            lVar7 = lVar7 + 8;
            lVar10 = lVar10 + 8;
            pTVar16 = local_938;
          } while (uVar12 != (uVar9 & 0x7fffffff));
        }
        uVar12 = local_940 + 1;
      } while (local_940 + 1 != local_8e8);
    }
    if (local_580.super_TPZVec<long>.fStore == local_580.fExtAlloc) {
      local_580.super_TPZVec<long>.fStore = (long *)0x0;
    }
    local_580.super_TPZVec<long>.fNAlloc = 0;
    local_580.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
    if (local_580.super_TPZVec<long>.fStore != (long *)0x0) {
      operator_delete__(local_580.super_TPZVec<long>.fStore);
    }
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_480,&PTR_PTR_018e0e30);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_258,&PTR_PTR_018e0e30);
    if ((uint *)local_930.fStore == local_910) {
      local_930.fStore = (int *)0x0;
    }
    local_930.fNAlloc = 0;
    local_930._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if ((uint *)local_930.fStore != (uint *)0x0) {
      operator_delete__(local_930.fStore);
    }
    if (local_8e0.super_TPZVec<int>.fStore == local_8e0.fExtAlloc) {
      local_8e0.super_TPZVec<int>.fStore = (int *)0x0;
    }
    local_8e0.super_TPZVec<int>.fNAlloc = 0;
    local_8e0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_8e0.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_8e0.super_TPZVec<int>.fStore);
    }
    if (local_880.super_TPZVec<long>.fStore == local_880.fExtAlloc) {
      local_880.super_TPZVec<long>.fStore = (long *)0x0;
    }
    local_880.super_TPZVec<long>.fNAlloc = 0;
    local_880.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
    if (local_880.super_TPZVec<long>.fStore != (long *)0x0) {
      operator_delete__(local_880.super_TPZVec<long>.fStore);
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {

    if(side==TSHAPE::NSides || point.size() != TSHAPE::Dimension-1){
        std::cout<<"Don't have side shape associated to this side";
        DebugStop();
    }
	if(TSHAPE::SideDimension(side)!= TSHAPE::Dimension -1 ){
		return ;
	}
    int ncontained = TSHAPE::NContainedSides(side);
    int nsideshape = 0;
    int connectlocid = SideConnectLocId(0, side);
    int order = this->Connect(connectlocid).Order();
    int is;
    for (is=0; is<ncontained; is++) {
        int ic = TSHAPE::ContainedSideLocId(side,is);
        nsideshape += TSHAPE::NConnectShapeF(ic,order);
    }
#ifdef PZDEBUG
    if (nsideshape != this->NSideShapeF(side)) {
        DebugStop();
    }
#endif

    TPZGeoEl *gel = this->Reference();
    //int nc = gel->NCornerNodes();
    int nsn = TSHAPE::NSideNodes(side);
    TPZManVector<int64_t,8> id(nsn);
    for (int ic=0; ic<nsn; ic++) {
        int locid = TSHAPE::SideNodeLocId(side,ic);
        id[ic] = gel->Node(locid).Id();
    }

    //int idsize = id.size();
    TPZManVector<int,9> permutegather(ncontained);
    int transformid;


    MElementType sidetype = TSHAPE::Type(side);
    switch (sidetype) {
        case EOned:
            transformid = pztopology::TPZLine::GetTransformId(id);
            pztopology::TPZLine::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EQuadrilateral:
            transformid = pztopology::TPZQuadrilateral::GetTransformId(id);
            pztopology::TPZQuadrilateral::GetSideHDivPermutation(transformid, permutegather);
            break;
        case ETriangle:
            transformid = pztopology::TPZTriangle::GetTransformId(id);
            pztopology::TPZTriangle::GetSideHDivPermutation(transformid, permutegather);
            break;
        default:
            DebugStop();
            break;
    }

    TPZManVector<int,TSHAPE::NSides> ord(TSHAPE::NSides,order);

    int sidedimension = TSHAPE::SideDimension(side);
    TPZFNMatrix<50,REAL> philoc(nsideshape,1),dphiloc(sidedimension,nsideshape);

    TSHAPE::SideShape(side,point,id,ord,philoc,dphiloc);

    int ncs = TSHAPE::NContainedSides(side);
    TPZManVector<int64_t,28> FirstIndex(ncs+1,0);
    for (int ls=0; ls<ncs; ls++) {
        int localside = TSHAPE::ContainedSideLocId(side,ls);
        FirstIndex[ls+1] = FirstIndex[ls]+TSHAPE::NConnectShapeF(localside,order);
    }

    REAL detjac = 1.;
    {
        TPZGeoElSide gelside = TPZGeoElSide(this->Reference(),side);
        int dim = gel->SideDimension(side);
        TPZFNMatrix<9,REAL> jac(dim,dim),jacinv(dim,dim),axes(dim,3);
        gelside.Jacobian(point, jac, axes, detjac, jacinv);
    }
    if(sidetype == ETriangle) detjac /= 6.;
    for (int side=0; side < ncs; side++) {
        int ifirst = FirstIndex[side];
        int kfirst = FirstIndex[permutegather[side]];
        int nshape = FirstIndex[side+1]-FirstIndex[side];
        for (int i=0; i<nshape; i++) {
            phi(ifirst+i,0) = philoc(kfirst+i,0)/detjac;
            for (int d=0; d< sidedimension; d++) {
                dphi(d,ifirst+i) = dphiloc(d,kfirst+i)/detjac;
            }
        }
    }

}